

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

void Extra_ThreshHeuristicTest(void)

{
  int T;
  word t;
  int Weights [16];
  
  t = 0xa888888088808880;
  T = Extra_ThreshHeuristic(&t,6,Weights);
  Extra_ThreshPrintWeights(T,Weights,6);
  return;
}

Assistant:

void Extra_ThreshHeuristicTest() {
	int nVars = 6;
	int T, Weights[16];

	//	word t = 19983902376700760000;
	word t = (s_Truths6[0] & s_Truths6[1] & s_Truths6[2])| (s_Truths6[0] & s_Truths6[1] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[1] & s_Truths6[4] & s_Truths6[5]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]);
	word * pT = &t;
	T = Extra_ThreshHeuristic(pT, nVars, Weights);
	Extra_ThreshPrintWeights(T, Weights, nVars);

}